

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O0

void __thiscall spvtools::opt::analysis::LivenessManager::ComputeLiveness(LivenessManager *this)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_16_2_633bb654 local_b0;
  function<void_(spvtools::opt::Instruction_*)> local_a0;
  Instruction *local_80;
  Instruction *arr_elt_type;
  Instruction *pIStack_70;
  uint32_t array_elt_type_id;
  Instruction *pte_type_inst;
  undefined4 local_60;
  uint32_t pte_type_id;
  uint32_t kPointerTypePointeeTypeInIdx;
  uint32_t var_id;
  StorageClass sc;
  uint32_t kPointerTypeStorageClassInIdx;
  Instruction *var_type_inst;
  Instruction *var;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  DefUseManager *def_use_mgr;
  LivenessManager *this_local;
  
  InitializeAnalysis(this);
  this_00 = context(this);
  this_01 = IRContext::get_def_use_mgr(this_00);
  context(this);
  IRContext::types_values((IRContext *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&var);
  do {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&var);
    if (!bVar1) {
      return;
    }
    var_type_inst =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = Instruction::opcode(var_type_inst);
    if (OVar2 == OpVariable) {
      uVar3 = Instruction::type_id(var_type_inst);
      _sc = DefUseManager::GetDef(this_01,uVar3);
      OVar2 = Instruction::opcode(_sc);
      if (OVar2 != OpTypePointer) {
        __assert_fail("var_type_inst->opcode() == spv::Op::OpTypePointer && \"Expected a pointer type\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp"
                      ,0x12f,"void spvtools::opt::analysis::LivenessManager::ComputeLiveness()");
      }
      var_id = 0;
      kPointerTypePointeeTypeInIdx = Instruction::GetSingleWordInOperand(_sc,0);
      if (kPointerTypePointeeTypeInIdx == 1) {
        pte_type_id = Instruction::result_id(var_type_inst);
        bVar1 = AnalyzeBuiltIn(this,pte_type_id);
        if (!bVar1) {
          local_60 = 1;
          pte_type_inst._4_4_ = Instruction::GetSingleWordInOperand(_sc,1);
          pIStack_70 = DefUseManager::GetDef(this_01,pte_type_inst._4_4_);
          OVar2 = Instruction::opcode(pIStack_70);
          if (OVar2 == OpTypeArray) {
            arr_elt_type._4_4_ = Instruction::GetSingleWordInOperand(pIStack_70,0);
            local_80 = DefUseManager::GetDef(this_01,arr_elt_type._4_4_);
            OVar2 = Instruction::opcode(local_80);
            if ((OVar2 == OpTypeStruct) && (bVar1 = AnalyzeBuiltIn(this,arr_elt_type._4_4_), bVar1))
            goto LAB_003de884;
          }
          uVar3 = pte_type_id;
          local_b0.var = var_type_inst;
          local_b0.this = this;
          std::function<void(spvtools::opt::Instruction*)>::
          function<spvtools::opt::analysis::LivenessManager::ComputeLiveness()::__0,void>
                    ((function<void(spvtools::opt::Instruction*)> *)&local_a0,&local_b0);
          DefUseManager::ForEachUser(this_01,uVar3,&local_a0);
          std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_a0);
        }
      }
    }
LAB_003de884:
    InstructionList::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

void LivenessManager::ComputeLiveness() {
  InitializeAnalysis();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  // Process all input variables
  for (auto& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    Instruction* var_type_inst = def_use_mgr->GetDef(var.type_id());
    assert(var_type_inst->opcode() == spv::Op::OpTypePointer &&
           "Expected a pointer type");
    const uint32_t kPointerTypeStorageClassInIdx = 0;
    spv::StorageClass sc = static_cast<spv::StorageClass>(
        var_type_inst->GetSingleWordInOperand(kPointerTypeStorageClassInIdx));
    if (sc != spv::StorageClass::Input) {
      continue;
    }
    // If var is builtin, mark live if analyzed and continue to next variable
    auto var_id = var.result_id();
    if (AnalyzeBuiltIn(var_id)) continue;
    // If interface block with builtin members, mark live if analyzed and
    // continue to next variable. Input interface blocks will only appear
    // in tesc, tese and geom shaders. Will need to strip off one level of
    // arrayness to get to block type.
    const uint32_t kPointerTypePointeeTypeInIdx = 1;
    uint32_t pte_type_id =
        var_type_inst->GetSingleWordInOperand(kPointerTypePointeeTypeInIdx);
    Instruction* pte_type_inst = def_use_mgr->GetDef(pte_type_id);
    if (pte_type_inst->opcode() == spv::Op::OpTypeArray) {
      uint32_t array_elt_type_id = pte_type_inst->GetSingleWordInOperand(0);
      Instruction* arr_elt_type = def_use_mgr->GetDef(array_elt_type_id);
      if (arr_elt_type->opcode() == spv::Op::OpTypeStruct) {
        if (AnalyzeBuiltIn(array_elt_type_id)) continue;
      }
    }
    // Mark all used locations of var live
    def_use_mgr->ForEachUser(var_id, [this, &var](Instruction* user) {
      auto op = user->opcode();
      if (op == spv::Op::OpEntryPoint || op == spv::Op::OpName ||
          op == spv::Op::OpDecorate || user->IsNonSemanticInstruction()) {
        return;
      }
      MarkRefLive(user, &var);
    });
  }
}